

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::Version::AddIterators
          (Version *this,ReadOptions *options,
          vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *iters)

{
  TableCache *this_00;
  uint64_t file_number;
  ulong uVar1;
  size_t sVar2;
  vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *options_00;
  bool bVar3;
  size_type sVar4;
  reference ppFVar5;
  Iterator *local_40;
  int local_34;
  Iterator *pIStack_30;
  int level;
  ulong local_28;
  size_t i;
  vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *iters_local;
  ReadOptions *options_local;
  Version *this_local;
  
  local_28 = 0;
  i = (size_t)iters;
  iters_local = (vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)options;
  options_local = (ReadOptions *)this;
  while( true ) {
    uVar1 = local_28;
    sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (this->files_);
    options_00 = iters_local;
    sVar2 = i;
    if (sVar4 <= uVar1) break;
    this_00 = this->vset_->table_cache_;
    ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[](this->files_,local_28);
    file_number = (*ppFVar5)->number;
    ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[](this->files_,local_28);
    pIStack_30 = TableCache::NewIterator
                           (this_00,(ReadOptions *)options_00,file_number,(*ppFVar5)->file_size,
                            (Table **)0x0);
    std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::push_back
              ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)sVar2,
               &stack0xffffffffffffffd0);
    local_28 = local_28 + 1;
  }
  for (local_34 = 1; local_34 < 7; local_34 = local_34 + 1) {
    bVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                      (this->files_ + local_34);
    sVar2 = i;
    if (!bVar3) {
      local_40 = NewConcatenatingIterator(this,(ReadOptions *)iters_local,local_34);
      std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::push_back
                ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)sVar2,
                 &local_40);
    }
  }
  return;
}

Assistant:

void Version::AddIterators(const ReadOptions& options,
                           std::vector<Iterator*>* iters) {
  // Merge all level zero files together since they may overlap
  for (size_t i = 0; i < files_[0].size(); i++) {
    iters->push_back(vset_->table_cache_->NewIterator(
        options, files_[0][i]->number, files_[0][i]->file_size));
  }

  // For levels > 0, we can use a concatenating iterator that sequentially
  // walks through the non-overlapping files in the level, opening them
  // lazily.
  for (int level = 1; level < config::kNumLevels; level++) {
    if (!files_[level].empty()) {
      iters->push_back(NewConcatenatingIterator(options, level));
    }
  }
}